

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_TestShell::createTest
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x242);
  TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test::
  TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test
            ((TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCalls)
{
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);
    LONGS_EQUAL(1, mock().expectedCallsLeft());
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);

    mock().checkExpectations();
}